

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::InstanceArrayISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,InstanceArrayISA *this,PrimRef *prims,BBox1f *time_range
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  LBBox3fa *pLVar3;
  ulong instance;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  BBox1f BVar7;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar11 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar13 [16];
  BBox1f t0t1;
  LBBox3fa lbounds;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  BBox1f local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  BVar7 = Geometry::getTimeRange((Geometry *)this);
  fVar6 = time_range->lower;
  if (time_range->lower <= BVar7.lower) {
    fVar6 = BVar7.lower;
  }
  aVar8._4_4_ = BVar7.upper;
  aVar8.m128[0] = aVar8._4_4_;
  aVar8.m128[2] = aVar8._4_4_;
  aVar8.m128[3] = aVar8._4_4_;
  if (time_range->upper <= aVar8._4_4_) {
    aVar8.m128[0] = time_range->upper;
  }
  local_a0.upper = aVar8.m128[0];
  local_a0.lower = fVar6;
  if (fVar6 <= aVar8.m128[0]) {
    instance = r->_begin;
    sVar5 = 0;
    local_c8 = _DAT_01f45a40;
    local_d8 = _DAT_01f45a30;
    local_88 = _DAT_01f45a30;
    local_98 = _DAT_01f45a40;
    for (; instance < r->_end; instance = instance + 1) {
      if ((*(long *)&(this->super_InstanceArray).super_Geometry.field_0x58 != 0) ||
         (pLVar3 = (LBBox3fa *)(this->super_InstanceArray).object_ids.super_RawBufferView.ptr_ofs,
         ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         ((long)&(pLVar3->bounds0).lower.field_0 +
         (this->super_InstanceArray).object_ids.super_RawBufferView.stride * instance))->m128[0] !=
         -NAN)) {
        pLVar3 = InstanceArray::nonlinearBounds
                           ((LBBox3fa *)&local_78.field_1,&this->super_InstanceArray,instance,
                            &local_a0,&(this->super_InstanceArray).super_Geometry.time_range,
                            (this->super_InstanceArray).super_Geometry.fnumTimeSegments);
        aVar8 = local_78;
      }
      aVar8.m128 = (__m128)minps(aVar8.m128,local_58);
      auVar11 = maxps(local_68,local_48);
      fVar6 = aVar8.m128[0];
      fVar9 = aVar8.m128[1];
      fVar10 = aVar8.m128[2];
      auVar1._4_4_ = -(uint)(auVar11._4_4_ < 1.844e+18 && -1.844e+18 < fVar9);
      auVar1._0_4_ = -(uint)(auVar11._0_4_ < 1.844e+18 && -1.844e+18 < fVar6);
      auVar1._8_4_ = -(uint)(auVar11._8_4_ < 1.844e+18 && -1.844e+18 < fVar10);
      auVar1._12_4_ = -(uint)(auVar11._12_4_ < 1.844e+18 && -1.844e+18 < aVar8.m128[3]);
      uVar2 = movmskps((int)pLVar3,auVar1);
      sVar4 = k;
      if ((~(byte)uVar2 & 7) == 0) {
        aVar8.m128[3] = (float)geomID;
        aVar12._0_12_ = auVar11._0_12_;
        aVar12.m128[3] = (float)instance;
        local_d8 = minps(local_d8,(undefined1  [16])aVar8);
        local_c8 = maxps(local_c8,(undefined1  [16])aVar12);
        auVar13._0_4_ = fVar6 + auVar11._0_4_;
        auVar13._4_4_ = fVar9 + auVar11._4_4_;
        auVar13._8_4_ = fVar10 + auVar11._8_4_;
        auVar13._12_4_ = (float)geomID + (float)instance;
        local_88 = minps(local_88,auVar13);
        local_98 = maxps(local_98,auVar13);
        sVar5 = sVar5 + 1;
        sVar4 = k + 1;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(prims + k) = aVar8;
        prims[k].upper.field_0 = aVar12;
      }
      k = sVar4;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_d8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_d8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_c8._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = local_88;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = local_98;
    __return_storage_ptr__->end = sVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;

        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = linearBounds(j, t0t1);
          if (!isvalid(lbounds.bounds()))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }